

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O1

float f__cabs(float real,float imag)

{
  float fVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = -real;
  if (-real <= real) {
    fVar3 = real;
  }
  fVar4 = -imag;
  if (-imag <= imag) {
    fVar4 = imag;
  }
  fVar1 = fVar4;
  if (fVar4 <= fVar3) {
    fVar1 = fVar3;
  }
  if ((fVar3 + fVar4 == fVar1) && (!NAN(fVar3 + fVar4) && !NAN(fVar1))) {
    return fVar1;
  }
  if (fVar4 <= fVar3) {
    fVar3 = fVar4;
  }
  dVar2 = (double)((fVar3 / fVar1) * (fVar3 / fVar1)) + 1.0;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return (float)(dVar2 * (double)fVar1);
}

Assistant:

float
f__cabs(float real, float imag)
#endif
{
    float temp;

    if (real < 0)
        real = -real;
    if (imag < 0)
        imag = -imag;
    if (imag > real) {
        temp = real;
        real = imag;
        imag = temp;
    }
    if ((imag + real) == real)
        return ((float) real);

    temp = imag / real;
    temp = real * sqrt(1.0 + temp * temp);      /*overflow!! */
    return (temp);
}